

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.hpp
# Opt level: O3

Task * __thiscall tf::Task::precede<tf::Task&,tf::Task&>(Task *this,Task *tasks,Task *tasks_1)

{
  Node *pNVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  undefined8 uVar5;
  Node *local_38;
  Node *local_30;
  
  pNVar1 = this->_node;
  local_30 = tasks->_node;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&pNVar1->_edges,&local_30);
  sVar2 = pNVar1->_num_successors;
  pvVar3 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  pNVar1->_num_successors = sVar2 + 1;
  pvVar4 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
  uVar5 = *(undefined8 *)((long)pvVar3 + sVar2 * 8);
  *(undefined8 *)((long)pvVar3 + sVar2 * 8) = *(undefined8 *)((long)pvVar4 + -8);
  *(undefined8 *)((long)pvVar4 + -8) = uVar5;
  local_38 = pNVar1;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&local_30->_edges,&local_38);
  pNVar1 = this->_node;
  local_30 = tasks_1->_node;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&pNVar1->_edges,&local_30);
  sVar2 = pNVar1->_num_successors;
  pvVar3 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  pNVar1->_num_successors = sVar2 + 1;
  pvVar4 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
  uVar5 = *(undefined8 *)((long)pvVar3 + sVar2 * 8);
  *(undefined8 *)((long)pvVar3 + sVar2 * 8) = *(undefined8 *)((long)pvVar4 + -8);
  *(undefined8 *)((long)pvVar4 + -8) = uVar5;
  local_38 = pNVar1;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&local_30->_edges,&local_38);
  return this;
}

Assistant:

Task& Task::precede(Ts&&... tasks) {
  (_node->_precede(tasks._node), ...);
  //_precede(std::forward<Ts>(tasks)...);
  return *this;
}